

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsBuiltinPrecisionTests.cpp
# Opt level: O1

Inputs<deqp::gls::BuiltinPrecisionTests::InTypes<tcu::Vector<float,_2>,_tcu::Vector<float,_2>,_tcu::Vector<float,_2>,_deqp::gls::BuiltinPrecisionTests::Void>_>
* __thiscall
deqp::gls::BuiltinPrecisionTests::
generateInputs<deqp::gls::BuiltinPrecisionTests::InTypes<tcu::Vector<float,2>,tcu::Vector<float,2>,tcu::Vector<float,2>,deqp::gls::BuiltinPrecisionTests::Void>>
          (Inputs<deqp::gls::BuiltinPrecisionTests::InTypes<tcu::Vector<float,_2>,_tcu::Vector<float,_2>,_tcu::Vector<float,_2>,_deqp::gls::BuiltinPrecisionTests::Void>_>
           *__return_storage_ptr__,BuiltinPrecisionTests *this,
          Samplings<deqp::gls::BuiltinPrecisionTests::InTypes<tcu::Vector<float,_2>,_tcu::Vector<float,_2>,_tcu::Vector<float,_2>,_deqp::gls::BuiltinPrecisionTests::Void>_>
          *samplings,FloatFormat *floatFormat,Precision intPrecision,size_t numSamples,Random *rnd)

{
  iterator iVar1;
  BuiltinPrecisionTests *pBVar2;
  Samplings<deqp::gls::BuiltinPrecisionTests::InTypes<tcu::Vector<float,_2>,_tcu::Vector<float,_2>,_tcu::Vector<float,_2>,_deqp::gls::BuiltinPrecisionTests::Void>_>
  *pSVar3;
  size_t sVar4;
  const_iterator cVar5;
  undefined4 uVar6;
  long lVar7;
  long lVar8;
  undefined4 in_register_00000084;
  long lVar9;
  ulong uVar10;
  long lVar11;
  In3 in3;
  Inputs<deqp::gls::BuiltinPrecisionTests::InTypes<tcu::Vector<float,_2>,_tcu::Vector<float,_2>,_tcu::Vector<float,_2>,_deqp::gls::BuiltinPrecisionTests::Void>_>
  fixedInputs;
  InTuple<deqp::gls::BuiltinPrecisionTests::InTypes<tcu::Vector<float,_2>,_tcu::Vector<float,_2>,_tcu::Vector<float,_2>,_deqp::gls::BuiltinPrecisionTests::Void>_>
  tuple;
  In2 in2;
  In1 in1;
  In0 in0;
  set<deqp::gls::BuiltinPrecisionTests::InTuple<deqp::gls::BuiltinPrecisionTests::InTypes<tcu::Vector<float,_2>,_tcu::Vector<float,_2>,_tcu::Vector<float,_2>,_deqp::gls::BuiltinPrecisionTests::Void>_>,_deqp::gls::BuiltinPrecisionTests::InputLess<deqp::gls::BuiltinPrecisionTests::InTuple<deqp::gls::BuiltinPrecisionTests::InTypes<tcu::Vector<float,_2>,_tcu::Vector<float,_2>,_tcu::Vector<float,_2>,_deqp::gls::BuiltinPrecisionTests::Void>_>_>,_std::allocator<deqp::gls::BuiltinPrecisionTests::InTuple<deqp::gls::BuiltinPrecisionTests::InTypes<tcu::Vector<float,_2>,_tcu::Vector<float,_2>,_tcu::Vector<float,_2>,_deqp::gls::BuiltinPrecisionTests::Void>_>_>_>
  seenInputs;
  Void local_155;
  undefined4 local_154;
  vector<deqp::gls::BuiltinPrecisionTests::Void,std::allocator<deqp::gls::BuiltinPrecisionTests::Void>>
  *local_150;
  vector<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_> *local_148;
  vector<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_> *local_140;
  void *local_138;
  void *pvStack_130;
  long local_128;
  void *pvStack_120;
  void *local_118;
  long lStack_110;
  void *local_108;
  void *pvStack_100;
  long local_f8;
  void *pvStack_f0;
  void *local_e8;
  long lStack_e0;
  undefined1 local_d0 [32];
  long local_b0;
  value_type local_a8;
  value_type local_a0;
  value_type local_98;
  BuiltinPrecisionTests *local_90;
  Samplings<deqp::gls::BuiltinPrecisionTests::InTypes<tcu::Vector<float,_2>,_tcu::Vector<float,_2>,_tcu::Vector<float,_2>,_deqp::gls::BuiltinPrecisionTests::Void>_>
  *local_88;
  size_t local_80;
  ulong local_78;
  ulong local_70;
  ulong local_68;
  _Rb_tree<deqp::gls::BuiltinPrecisionTests::InTuple<deqp::gls::BuiltinPrecisionTests::InTypes<tcu::Vector<float,_2>,_tcu::Vector<float,_2>,_tcu::Vector<float,_2>,_deqp::gls::BuiltinPrecisionTests::Void>_>,_deqp::gls::BuiltinPrecisionTests::InTuple<deqp::gls::BuiltinPrecisionTests::InTypes<tcu::Vector<float,_2>,_tcu::Vector<float,_2>,_tcu::Vector<float,_2>,_deqp::gls::BuiltinPrecisionTests::Void>_>,_std::_Identity<deqp::gls::BuiltinPrecisionTests::InTuple<deqp::gls::BuiltinPrecisionTests::InTypes<tcu::Vector<float,_2>,_tcu::Vector<float,_2>,_tcu::Vector<float,_2>,_deqp::gls::BuiltinPrecisionTests::Void>_>_>,_deqp::gls::BuiltinPrecisionTests::InputLess<deqp::gls::BuiltinPrecisionTests::InTuple<deqp::gls::BuiltinPrecisionTests::InTypes<tcu::Vector<float,_2>,_tcu::Vector<float,_2>,_tcu::Vector<float,_2>,_deqp::gls::BuiltinPrecisionTests::Void>_>_>,_std::allocator<deqp::gls::BuiltinPrecisionTests::InTuple<deqp::gls::BuiltinPrecisionTests::InTypes<tcu::Vector<float,_2>,_tcu::Vector<float,_2>,_tcu::Vector<float,_2>,_deqp::gls::BuiltinPrecisionTests::Void>_>_>_>
  local_60;
  
  local_b0 = CONCAT44(in_register_00000084,intPrecision);
  local_154 = SUB84(floatFormat,0);
  (__return_storage_ptr__->in3).
  super__Vector_base<deqp::gls::BuiltinPrecisionTests::Void,_std::allocator<deqp::gls::BuiltinPrecisionTests::Void>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->in3).
  super__Vector_base<deqp::gls::BuiltinPrecisionTests::Void,_std::allocator<deqp::gls::BuiltinPrecisionTests::Void>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->in2).
  super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->in3).
  super__Vector_base<deqp::gls::BuiltinPrecisionTests::Void,_std::allocator<deqp::gls::BuiltinPrecisionTests::Void>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->in2).
  super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->in2).
  super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->in1).
  super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->in1).
  super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->in0).
  super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->in1).
  super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->in0).
  super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->in0).
  super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_e8 = (void *)0x0;
  lStack_e0 = 0;
  local_f8 = 0;
  pvStack_f0 = (void *)0x0;
  local_108 = (void *)0x0;
  pvStack_100 = (void *)0x0;
  local_118 = (void *)0x0;
  lStack_110 = 0;
  local_128 = 0;
  pvStack_120 = (void *)0x0;
  local_138 = (void *)0x0;
  pvStack_130 = (void *)0x0;
  local_60._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_60._M_impl.super__Rb_tree_header._M_header;
  local_60._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_60._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_60._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_80 = numSamples;
  local_60._M_impl.super__Rb_tree_header._M_header._M_right =
       local_60._M_impl.super__Rb_tree_header._M_header._M_left;
  (**(code **)**(undefined8 **)this)(*(undefined8 **)this,samplings);
  (**(code **)**(undefined8 **)(this + 8))(*(undefined8 **)(this + 8),samplings,&pvStack_120);
  (**(code **)**(undefined8 **)(this + 0x10))(*(undefined8 **)(this + 0x10),samplings,&local_108);
  (**(code **)**(undefined8 **)(this + 0x18))(*(undefined8 **)(this + 0x18),samplings,&pvStack_f0);
  local_90 = this;
  local_88 = samplings;
  if (pvStack_130 != local_138) {
    local_140 = &__return_storage_ptr__->in1;
    local_148 = &__return_storage_ptr__->in2;
    local_150 = (vector<deqp::gls::BuiltinPrecisionTests::Void,std::allocator<deqp::gls::BuiltinPrecisionTests::Void>>
                 *)&__return_storage_ptr__->in3;
    lVar7 = 0;
    uVar10 = 0;
    do {
      local_78 = uVar10;
      if (local_118 != pvStack_120) {
        lVar11 = 0;
        uVar10 = 0;
        do {
          local_70 = uVar10;
          if (pvStack_100 != local_108) {
            lVar9 = 0;
            uVar10 = 0;
            do {
              local_68 = uVar10;
              if (local_e8 != pvStack_f0) {
                uVar10 = 0;
                do {
                  lVar8 = 0;
                  do {
                    *(undefined4 *)(local_d0 + lVar8 * 4) =
                         *(undefined4 *)((long)local_138 + lVar8 * 4 + lVar7);
                    lVar8 = lVar8 + 1;
                  } while (lVar8 == 1);
                  lVar8 = 0;
                  do {
                    *(undefined4 *)(local_d0 + lVar8 * 4 + 8) =
                         *(undefined4 *)((long)pvStack_120 + lVar8 * 4 + lVar11);
                    lVar8 = lVar8 + 1;
                  } while (lVar8 == 1);
                  lVar8 = 0;
                  do {
                    *(undefined4 *)(local_d0 + lVar8 * 4 + 0x10) =
                         *(undefined4 *)((long)local_108 + lVar8 * 4 + lVar9);
                    lVar8 = lVar8 + 1;
                  } while (lVar8 == 1);
                  std::
                  _Rb_tree<deqp::gls::BuiltinPrecisionTests::InTuple<deqp::gls::BuiltinPrecisionTests::InTypes<tcu::Vector<float,2>,tcu::Vector<float,2>,tcu::Vector<float,2>,deqp::gls::BuiltinPrecisionTests::Void>>,deqp::gls::BuiltinPrecisionTests::InTuple<deqp::gls::BuiltinPrecisionTests::InTypes<tcu::Vector<float,2>,tcu::Vector<float,2>,tcu::Vector<float,2>,deqp::gls::BuiltinPrecisionTests::Void>>,std::_Identity<deqp::gls::BuiltinPrecisionTests::InTuple<deqp::gls::BuiltinPrecisionTests::InTypes<tcu::Vector<float,2>,tcu::Vector<float,2>,tcu::Vector<float,2>,deqp::gls::BuiltinPrecisionTests::Void>>>,deqp::gls::BuiltinPrecisionTests::InputLess<deqp::gls::BuiltinPrecisionTests::InTuple<deqp::gls::BuiltinPrecisionTests::InTypes<tcu::Vector<float,2>,tcu::Vector<float,2>,tcu::Vector<float,2>,deqp::gls::BuiltinPrecisionTests::Void>>>,std::allocator<deqp::gls::BuiltinPrecisionTests::InTuple<deqp::gls::BuiltinPrecisionTests::InTypes<tcu::Vector<float,2>,tcu::Vector<float,2>,tcu::Vector<float,2>,deqp::gls::BuiltinPrecisionTests::Void>>>>
                  ::
                  _M_insert_unique<deqp::gls::BuiltinPrecisionTests::InTuple<deqp::gls::BuiltinPrecisionTests::InTypes<tcu::Vector<float,2>,tcu::Vector<float,2>,tcu::Vector<float,2>,deqp::gls::BuiltinPrecisionTests::Void>>const&>
                            ((_Rb_tree<deqp::gls::BuiltinPrecisionTests::InTuple<deqp::gls::BuiltinPrecisionTests::InTypes<tcu::Vector<float,2>,tcu::Vector<float,2>,tcu::Vector<float,2>,deqp::gls::BuiltinPrecisionTests::Void>>,deqp::gls::BuiltinPrecisionTests::InTuple<deqp::gls::BuiltinPrecisionTests::InTypes<tcu::Vector<float,2>,tcu::Vector<float,2>,tcu::Vector<float,2>,deqp::gls::BuiltinPrecisionTests::Void>>,std::_Identity<deqp::gls::BuiltinPrecisionTests::InTuple<deqp::gls::BuiltinPrecisionTests::InTypes<tcu::Vector<float,2>,tcu::Vector<float,2>,tcu::Vector<float,2>,deqp::gls::BuiltinPrecisionTests::Void>>>,deqp::gls::BuiltinPrecisionTests::InputLess<deqp::gls::BuiltinPrecisionTests::InTuple<deqp::gls::BuiltinPrecisionTests::InTypes<tcu::Vector<float,2>,tcu::Vector<float,2>,tcu::Vector<float,2>,deqp::gls::BuiltinPrecisionTests::Void>>>,std::allocator<deqp::gls::BuiltinPrecisionTests::InTuple<deqp::gls::BuiltinPrecisionTests::InTypes<tcu::Vector<float,2>,tcu::Vector<float,2>,tcu::Vector<float,2>,deqp::gls::BuiltinPrecisionTests::Void>>>>
                              *)&local_60,
                             (InTuple<deqp::gls::BuiltinPrecisionTests::InTypes<tcu::Vector<float,_2>,_tcu::Vector<float,_2>,_tcu::Vector<float,_2>,_deqp::gls::BuiltinPrecisionTests::Void>_>
                              *)local_d0);
                  std::vector<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>::
                  push_back(&__return_storage_ptr__->in0,(value_type *)local_d0);
                  std::vector<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>::
                  push_back(local_140,(value_type *)(local_d0 + 8));
                  std::vector<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>::
                  push_back(local_148,(value_type *)(local_d0 + 0x10));
                  iVar1._M_current =
                       (__return_storage_ptr__->in3).
                       super__Vector_base<deqp::gls::BuiltinPrecisionTests::Void,_std::allocator<deqp::gls::BuiltinPrecisionTests::Void>_>
                       ._M_impl.super__Vector_impl_data._M_finish;
                  if (iVar1._M_current ==
                      (__return_storage_ptr__->in3).
                      super__Vector_base<deqp::gls::BuiltinPrecisionTests::Void,_std::allocator<deqp::gls::BuiltinPrecisionTests::Void>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage) {
                    std::
                    vector<deqp::gls::BuiltinPrecisionTests::Void,std::allocator<deqp::gls::BuiltinPrecisionTests::Void>>
                    ::_M_realloc_insert<deqp::gls::BuiltinPrecisionTests::Void_const&>
                              (local_150,iVar1,(Void *)(local_d0 + 0x18));
                  }
                  else {
                    (__return_storage_ptr__->in3).
                    super__Vector_base<deqp::gls::BuiltinPrecisionTests::Void,_std::allocator<deqp::gls::BuiltinPrecisionTests::Void>_>
                    ._M_impl.super__Vector_impl_data._M_finish = iVar1._M_current + 1;
                  }
                  uVar10 = uVar10 + 1;
                } while (uVar10 < (ulong)((long)local_e8 - (long)pvStack_f0));
              }
              uVar10 = local_68 + 1;
              lVar9 = lVar9 + 8;
            } while (uVar10 < (ulong)((long)pvStack_100 - (long)local_108 >> 3));
          }
          uVar10 = local_70 + 1;
          lVar11 = lVar11 + 8;
        } while (uVar10 < (ulong)((long)local_118 - (long)pvStack_120 >> 3));
      }
      uVar10 = local_78 + 1;
      lVar7 = lVar7 + 8;
    } while (uVar10 < (ulong)((long)pvStack_130 - (long)local_138 >> 3));
  }
  sVar4 = local_80;
  pSVar3 = local_88;
  pBVar2 = local_90;
  if (local_b0 != 0) {
    local_140 = &__return_storage_ptr__->in1;
    local_148 = &__return_storage_ptr__->in2;
    local_150 = (vector<deqp::gls::BuiltinPrecisionTests::Void,std::allocator<deqp::gls::BuiltinPrecisionTests::Void>>
                 *)&__return_storage_ptr__->in3;
    uVar6 = local_154;
    do {
      (**(code **)(**(long **)pBVar2 + 8))(&local_98,*(long **)pBVar2,pSVar3,uVar6,sVar4);
      (**(code **)(**(long **)(pBVar2 + 8) + 8))
                (&local_a0,*(long **)(pBVar2 + 8),pSVar3,uVar6,sVar4);
      (**(code **)(**(long **)(pBVar2 + 0x10) + 8))
                (&local_a8,*(long **)(pBVar2 + 0x10),pSVar3,uVar6,sVar4);
      (**(code **)(**(long **)(pBVar2 + 0x18) + 8))(*(long **)(pBVar2 + 0x18),pSVar3,uVar6,sVar4);
      local_d0._0_4_ = local_98.m_data[0];
      local_d0._4_4_ = local_98.m_data[1];
      local_d0._8_4_ = local_a0.m_data[0];
      local_d0._12_4_ = local_a0.m_data[1];
      local_d0._16_4_ = local_a8.m_data[0];
      local_d0._20_4_ = local_a8.m_data[1];
      cVar5 = std::
              _Rb_tree<deqp::gls::BuiltinPrecisionTests::InTuple<deqp::gls::BuiltinPrecisionTests::InTypes<tcu::Vector<float,_2>,_tcu::Vector<float,_2>,_tcu::Vector<float,_2>,_deqp::gls::BuiltinPrecisionTests::Void>_>,_deqp::gls::BuiltinPrecisionTests::InTuple<deqp::gls::BuiltinPrecisionTests::InTypes<tcu::Vector<float,_2>,_tcu::Vector<float,_2>,_tcu::Vector<float,_2>,_deqp::gls::BuiltinPrecisionTests::Void>_>,_std::_Identity<deqp::gls::BuiltinPrecisionTests::InTuple<deqp::gls::BuiltinPrecisionTests::InTypes<tcu::Vector<float,_2>,_tcu::Vector<float,_2>,_tcu::Vector<float,_2>,_deqp::gls::BuiltinPrecisionTests::Void>_>_>,_deqp::gls::BuiltinPrecisionTests::InputLess<deqp::gls::BuiltinPrecisionTests::InTuple<deqp::gls::BuiltinPrecisionTests::InTypes<tcu::Vector<float,_2>,_tcu::Vector<float,_2>,_tcu::Vector<float,_2>,_deqp::gls::BuiltinPrecisionTests::Void>_>_>,_std::allocator<deqp::gls::BuiltinPrecisionTests::InTuple<deqp::gls::BuiltinPrecisionTests::InTypes<tcu::Vector<float,_2>,_tcu::Vector<float,_2>,_tcu::Vector<float,_2>,_deqp::gls::BuiltinPrecisionTests::Void>_>_>_>
              ::find(&local_60,(key_type *)local_d0);
      uVar6 = local_154;
      if ((_Rb_tree_header *)cVar5._M_node == &local_60._M_impl.super__Rb_tree_header) {
        std::
        _Rb_tree<deqp::gls::BuiltinPrecisionTests::InTuple<deqp::gls::BuiltinPrecisionTests::InTypes<tcu::Vector<float,2>,tcu::Vector<float,2>,tcu::Vector<float,2>,deqp::gls::BuiltinPrecisionTests::Void>>,deqp::gls::BuiltinPrecisionTests::InTuple<deqp::gls::BuiltinPrecisionTests::InTypes<tcu::Vector<float,2>,tcu::Vector<float,2>,tcu::Vector<float,2>,deqp::gls::BuiltinPrecisionTests::Void>>,std::_Identity<deqp::gls::BuiltinPrecisionTests::InTuple<deqp::gls::BuiltinPrecisionTests::InTypes<tcu::Vector<float,2>,tcu::Vector<float,2>,tcu::Vector<float,2>,deqp::gls::BuiltinPrecisionTests::Void>>>,deqp::gls::BuiltinPrecisionTests::InputLess<deqp::gls::BuiltinPrecisionTests::InTuple<deqp::gls::BuiltinPrecisionTests::InTypes<tcu::Vector<float,2>,tcu::Vector<float,2>,tcu::Vector<float,2>,deqp::gls::BuiltinPrecisionTests::Void>>>,std::allocator<deqp::gls::BuiltinPrecisionTests::InTuple<deqp::gls::BuiltinPrecisionTests::InTypes<tcu::Vector<float,2>,tcu::Vector<float,2>,tcu::Vector<float,2>,deqp::gls::BuiltinPrecisionTests::Void>>>>
        ::
        _M_insert_unique<deqp::gls::BuiltinPrecisionTests::InTuple<deqp::gls::BuiltinPrecisionTests::InTypes<tcu::Vector<float,2>,tcu::Vector<float,2>,tcu::Vector<float,2>,deqp::gls::BuiltinPrecisionTests::Void>>const&>
                  ((_Rb_tree<deqp::gls::BuiltinPrecisionTests::InTuple<deqp::gls::BuiltinPrecisionTests::InTypes<tcu::Vector<float,2>,tcu::Vector<float,2>,tcu::Vector<float,2>,deqp::gls::BuiltinPrecisionTests::Void>>,deqp::gls::BuiltinPrecisionTests::InTuple<deqp::gls::BuiltinPrecisionTests::InTypes<tcu::Vector<float,2>,tcu::Vector<float,2>,tcu::Vector<float,2>,deqp::gls::BuiltinPrecisionTests::Void>>,std::_Identity<deqp::gls::BuiltinPrecisionTests::InTuple<deqp::gls::BuiltinPrecisionTests::InTypes<tcu::Vector<float,2>,tcu::Vector<float,2>,tcu::Vector<float,2>,deqp::gls::BuiltinPrecisionTests::Void>>>,deqp::gls::BuiltinPrecisionTests::InputLess<deqp::gls::BuiltinPrecisionTests::InTuple<deqp::gls::BuiltinPrecisionTests::InTypes<tcu::Vector<float,2>,tcu::Vector<float,2>,tcu::Vector<float,2>,deqp::gls::BuiltinPrecisionTests::Void>>>,std::allocator<deqp::gls::BuiltinPrecisionTests::InTuple<deqp::gls::BuiltinPrecisionTests::InTypes<tcu::Vector<float,2>,tcu::Vector<float,2>,tcu::Vector<float,2>,deqp::gls::BuiltinPrecisionTests::Void>>>>
                    *)&local_60,(key_type *)local_d0);
        std::vector<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>::push_back
                  (&__return_storage_ptr__->in0,&local_98);
        std::vector<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>::push_back
                  (local_140,&local_a0);
        std::vector<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>::push_back
                  (local_148,&local_a8);
        iVar1._M_current =
             (__return_storage_ptr__->in3).
             super__Vector_base<deqp::gls::BuiltinPrecisionTests::Void,_std::allocator<deqp::gls::BuiltinPrecisionTests::Void>_>
             ._M_impl.super__Vector_impl_data._M_finish;
        if (iVar1._M_current ==
            (__return_storage_ptr__->in3).
            super__Vector_base<deqp::gls::BuiltinPrecisionTests::Void,_std::allocator<deqp::gls::BuiltinPrecisionTests::Void>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage) {
          std::
          vector<deqp::gls::BuiltinPrecisionTests::Void,std::allocator<deqp::gls::BuiltinPrecisionTests::Void>>
          ::_M_realloc_insert<deqp::gls::BuiltinPrecisionTests::Void_const&>
                    (local_150,iVar1,&local_155);
        }
        else {
          (__return_storage_ptr__->in3).
          super__Vector_base<deqp::gls::BuiltinPrecisionTests::Void,_std::allocator<deqp::gls::BuiltinPrecisionTests::Void>_>
          ._M_impl.super__Vector_impl_data._M_finish = iVar1._M_current + 1;
        }
      }
      local_b0 = local_b0 + -1;
    } while (local_b0 != 0);
  }
  std::
  _Rb_tree<deqp::gls::BuiltinPrecisionTests::InTuple<deqp::gls::BuiltinPrecisionTests::InTypes<tcu::Vector<float,_2>,_tcu::Vector<float,_2>,_tcu::Vector<float,_2>,_deqp::gls::BuiltinPrecisionTests::Void>_>,_deqp::gls::BuiltinPrecisionTests::InTuple<deqp::gls::BuiltinPrecisionTests::InTypes<tcu::Vector<float,_2>,_tcu::Vector<float,_2>,_tcu::Vector<float,_2>,_deqp::gls::BuiltinPrecisionTests::Void>_>,_std::_Identity<deqp::gls::BuiltinPrecisionTests::InTuple<deqp::gls::BuiltinPrecisionTests::InTypes<tcu::Vector<float,_2>,_tcu::Vector<float,_2>,_tcu::Vector<float,_2>,_deqp::gls::BuiltinPrecisionTests::Void>_>_>,_deqp::gls::BuiltinPrecisionTests::InputLess<deqp::gls::BuiltinPrecisionTests::InTuple<deqp::gls::BuiltinPrecisionTests::InTypes<tcu::Vector<float,_2>,_tcu::Vector<float,_2>,_tcu::Vector<float,_2>,_deqp::gls::BuiltinPrecisionTests::Void>_>_>,_std::allocator<deqp::gls::BuiltinPrecisionTests::InTuple<deqp::gls::BuiltinPrecisionTests::InTypes<tcu::Vector<float,_2>,_tcu::Vector<float,_2>,_tcu::Vector<float,_2>,_deqp::gls::BuiltinPrecisionTests::Void>_>_>_>
  ::~_Rb_tree(&local_60);
  if (pvStack_f0 != (void *)0x0) {
    operator_delete(pvStack_f0,lStack_e0 - (long)pvStack_f0);
  }
  if (local_108 != (void *)0x0) {
    operator_delete(local_108,local_f8 - (long)local_108);
  }
  if (pvStack_120 != (void *)0x0) {
    operator_delete(pvStack_120,lStack_110 - (long)pvStack_120);
  }
  if (local_138 != (void *)0x0) {
    operator_delete(local_138,local_128 - (long)local_138);
  }
  return __return_storage_ptr__;
}

Assistant:

Inputs<In> generateInputs (const Samplings<In>&	samplings,
						   const FloatFormat&	floatFormat,
						   Precision			intPrecision,
						   size_t				numSamples,
						   Random&				rnd)
{
	Inputs<In>									ret;
	Inputs<In>									fixedInputs;
	set<InTuple<In>, InputLess<InTuple<In> > >	seenInputs;

	samplings.in0.genFixeds(floatFormat, fixedInputs.in0);
	samplings.in1.genFixeds(floatFormat, fixedInputs.in1);
	samplings.in2.genFixeds(floatFormat, fixedInputs.in2);
	samplings.in3.genFixeds(floatFormat, fixedInputs.in3);

	for (size_t ndx0 = 0; ndx0 < fixedInputs.in0.size(); ++ndx0)
	{
		for (size_t ndx1 = 0; ndx1 < fixedInputs.in1.size(); ++ndx1)
		{
			for (size_t ndx2 = 0; ndx2 < fixedInputs.in2.size(); ++ndx2)
			{
				for (size_t ndx3 = 0; ndx3 < fixedInputs.in3.size(); ++ndx3)
				{
					const InTuple<In>	tuple	(fixedInputs.in0[ndx0],
												 fixedInputs.in1[ndx1],
												 fixedInputs.in2[ndx2],
												 fixedInputs.in3[ndx3]);

					seenInputs.insert(tuple);
					ret.in0.push_back(tuple.a);
					ret.in1.push_back(tuple.b);
					ret.in2.push_back(tuple.c);
					ret.in3.push_back(tuple.d);
				}
			}
		}
	}

	for (size_t ndx = 0; ndx < numSamples; ++ndx)
	{
		const typename In::In0	in0		= samplings.in0.genRandom(floatFormat, intPrecision, rnd);
		const typename In::In1	in1		= samplings.in1.genRandom(floatFormat, intPrecision, rnd);
		const typename In::In2	in2		= samplings.in2.genRandom(floatFormat, intPrecision, rnd);
		const typename In::In3	in3		= samplings.in3.genRandom(floatFormat, intPrecision, rnd);
		const InTuple<In>		tuple	(in0, in1, in2, in3);

		if (de::contains(seenInputs, tuple))
			continue;

		seenInputs.insert(tuple);
		ret.in0.push_back(in0);
		ret.in1.push_back(in1);
		ret.in2.push_back(in2);
		ret.in3.push_back(in3);
	}

	return ret;
}